

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_features_state(lys_module *module,char *feature)

{
  byte bVar1;
  uint uVar2;
  lys_include *plVar3;
  lys_submodule *plVar4;
  int iVar5;
  lys_feature *plVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (feature != (char *)0x0 && module != (lys_module *)0x0) {
    uVar7 = (ulong)module->features_size;
    if (uVar7 != 0) {
      plVar6 = module->features;
      do {
        iVar5 = strcmp(feature,plVar6->name);
        if (iVar5 == 0) {
LAB_0015862d:
          uVar2._0_2_ = plVar6->flags;
          uVar2._2_1_ = plVar6->ext_size;
          uVar2._3_1_ = plVar6->iffeature_size;
          return uVar2 >> 8 & 1;
        }
        plVar6 = plVar6 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    bVar1 = module->inc_size;
    if ((ulong)bVar1 != 0) {
      plVar3 = module->inc;
      uVar7 = 0;
      do {
        plVar4 = plVar3[uVar7].submodule;
        uVar8 = (ulong)plVar4->features_size;
        if (uVar8 != 0) {
          plVar6 = plVar4->features;
          do {
            iVar5 = strcmp(feature,plVar6->name);
            if (iVar5 == 0) goto LAB_0015862d;
            plVar6 = plVar6 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != bVar1);
    }
  }
  return -1;
}

Assistant:

API int
lys_features_state(const struct lys_module *module, const char *feature)
{
    int i, j;

    if (!module || !feature) {
        return -1;
    }

    /* search for the specified feature */
    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        if (!strcmp(feature, module->features[i].name)) {
            if (module->features[i].flags & LYS_FENABLED) {
                return 1;
            } else {
                return 0;
            }
        }
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            if (!strcmp(feature, module->inc[j].submodule->features[i].name)) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    return 1;
                } else {
                    return 0;
                }
            }
        }
    }

    /* feature definition not found */
    return -1;
}